

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O2

Index __thiscall
MADPComponentDiscreteActions::GetActionIndexByName
          (MADPComponentDiscreteActions *this,string *s,Index agentI)

{
  pointer pvVar1;
  pointer pAVar2;
  __type_conflict _Var3;
  ostream *poVar4;
  E *pEVar5;
  ulong uVar6;
  Index unaff_EBP;
  pointer pAVar7;
  char *local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  if (this->_m_initialized == false) {
    pEVar5 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar5,"MADPComponentDiscreteActions::GetActionIndexByName - not initialized!");
    __cxa_throw(pEVar5,&E::typeinfo,E::~E);
  }
  pvVar1 = (this->_m_actionVecs).
           super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)agentI;
  if (uVar6 < (ulong)(((long)(this->_m_actionVecs).
                             super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18)) {
    pAVar7 = pvVar1[uVar6].super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pAVar2 = *(pointer *)
              ((long)&pvVar1[uVar6].
                      super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
                      super__Vector_impl_data + 8);
    do {
      if (pAVar7 == pAVar2) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar4 = std::operator<<(local_1a8,"GetActionIndexByName - action \"");
        poVar4 = std::operator<<(poVar4,(string *)s);
        poVar4 = std::operator<<(poVar4,"\" of agent ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," not found.");
        std::endl<char,std::char_traits<char>>(poVar4);
        pEVar5 = (E *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        E::E(pEVar5,local_1d8);
        __cxa_throw(pEVar5,&E::typeinfo,E::~E);
      }
      std::__cxx11::string::string
                ((string *)&ss,(string *)&(pAVar7->super_Action).super_NamedDescribedEntity._m_name)
      ;
      _Var3 = std::operator==(s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&ss);
      if (_Var3) {
        unaff_EBP = (pAVar7->super_DiscreteEntity)._m_index;
      }
      else {
        pAVar7 = pAVar7 + 1;
      }
      std::__cxx11::string::~string((string *)&ss);
    } while (!_Var3);
    return unaff_EBP;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar4 = std::operator<<(local_1a8,"GetActionIndexByName -  Agent index (");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,") out of bounds! (_m_actionVecs contains actions for ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4," agents...)\n");
  pEVar5 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar5,&ss);
  __cxa_throw(pEVar5,&E::typeinfo,E::~E);
}

Assistant:

Index MADPComponentDiscreteActions::GetActionIndexByName(const string &s,
                                                         Index agentI) const
{
    if(!_m_initialized)
        throw E("MADPComponentDiscreteActions::GetActionIndexByName - not initialized!");

    if(agentI >= _m_actionVecs.size())
    {
        stringstream ss;
        ss << "GetActionIndexByName -  Agent index ("<<
            agentI<<") out of bounds! (_m_actionVecs contains actions for "<<
            _m_actionVecs.size() << " agents...)\n";
        throw E(ss);
    }
    vector<ActionDiscrete>::const_iterator it = _m_actionVecs[agentI].begin();
    vector<ActionDiscrete>::const_iterator last = _m_actionVecs[agentI].end();
    while(it != last)
    {
        string s2 = (*it).GetName();
        if(s == s2)
        //if(strcmp(s,s2) == 0)//match
            return( (*it).GetIndex() );
        it++;
    }
    //not found
    stringstream ss;
    ss << "GetActionIndexByName - action \"" << s << "\" of agent " << agentI <<
    " not found." << endl;
    throw E(ss.str().c_str());

}